

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CombLoops.cpp
# Opt level: O3

void __thiscall
StrongConnectedComponents::buildAdjList
          (StrongConnectedComponents *this,vector<int,_std::allocator<int>_> *nodes,SCCResult *sccr)

{
  vector<int,std::allocator<int>> *this_00;
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pvVar4;
  iterator __position;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  pointer pvVar6;
  uint uVar7;
  ulong uVar8;
  int succ;
  int local_54;
  long local_50;
  StrongConnectedComponents *local_48;
  SCCResult *local_40;
  long local_38;
  
  piVar2 = (nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_erase_at_end(&sccr->adjList,
                    (sccr->adjList).
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_48 = this;
  local_40 = sccr;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&sccr->adjList,
           ((long)(this->adjList).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->adjList).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_50 = (long)piVar3 - (long)piVar2;
  if (local_50 != 0 &&
      (nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start !=
      (nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_50 = local_50 >> 2;
    local_50 = local_50 + (ulong)(local_50 == 0);
    local_38 = 0;
    do {
      iVar1 = (nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
              ._M_start[local_38];
      pvVar4 = (local_40->adjList).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      this_00 = (vector<int,std::allocator<int>> *)(pvVar4 + iVar1);
      pvVar6 = (local_48->adjList).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + iVar1;
      piVar2 = *(pointer *)&pvVar4[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl;
      if (*(pointer *)
           ((long)&pvVar4[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) !=
          piVar2) {
        *(pointer *)(this_00 + 8) = piVar2;
      }
      uVar7 = (uint)((ulong)((long)*(pointer *)
                                    ((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>).
                                            _M_impl.super__Vector_impl_data + 8) -
                            *(long *)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data) >> 2);
      if (0 < (int)uVar7) {
        uVar8 = 0;
        do {
          local_54 = *(int *)(*(long *)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data + uVar8 * 4);
          _Var5 = std::
                  __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                            ((nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start,
                             (nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish,&local_54);
          if (_Var5._M_current !=
              (nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
              ._M_finish) {
            __position._M_current = *(int **)(this_00 + 8);
            if (__position._M_current == *(int **)(this_00 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (this_00,__position,&local_54);
            }
            else {
              *__position._M_current = local_54;
              *(int **)(this_00 + 8) = __position._M_current + 1;
            }
          }
          uVar8 = uVar8 + 1;
        } while ((uVar7 & 0x7fffffff) != uVar8);
      }
      local_38 = local_38 + 1;
    } while (local_38 != local_50);
  }
  return;
}

Assistant:

void StrongConnectedComponents::buildAdjList(const std::vector<int>& nodes, SCCResult& sccr) const {
    std::vector<std::vector<int>>& lowestIdAdjacencyList = sccr.getAdjListForWrite();
    auto nodes_s = nodes.size();
    lowestIdAdjacencyList.clear();
    lowestIdAdjacencyList.resize(adjList.size());
    if (!nodes.empty()) {
        for (int i = 0; i < nodes_s; i++) {
            int node = nodes[i];
            std::vector<int>& sccr_adjlist_node = lowestIdAdjacencyList[node];
            auto& adjList_node = adjList[node];
            sccr_adjlist_node.clear();
            const int ns = adjList_node.size();
            for (int j = 0; j < ns; j++) {
                int succ = adjList_node[j];
                if (find_vec(nodes, succ)) {
                    sccr_adjlist_node.push_back(succ);
                }
            }
        }
    }
}